

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOptions
          (Parser *this,LocationRecorder *parent_location,int optionsFieldNumber,
          Message *mutable_options)

{
  ErrorCollector *pEVar1;
  bool bVar2;
  LocationRecorder location;
  LocationRecorder local_50;
  Tokenizer *local_40;
  
  ConsumeEndOfDeclaration(this,"{",parent_location);
  bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
  if (!bVar2) {
    if ((this->input_->current_).type != TYPE_END) {
      do {
        bVar2 = TryConsumeEndOfDeclaration(this,";",(LocationRecorder *)0x0);
        if (!bVar2) {
          LocationRecorder::LocationRecorder(&local_50,parent_location,optionsFieldNumber);
          bVar2 = ParseOption(this,mutable_options,&local_50,OPTION_STATEMENT);
          if (!bVar2) {
            SkipStatement(this);
          }
          LocationRecorder::~LocationRecorder(&local_50);
        }
        bVar2 = TryConsumeEndOfDeclaration(this,"}",(LocationRecorder *)0x0);
        if (bVar2) {
          return bVar2;
        }
      } while ((this->input_->current_).type != TYPE_END);
    }
    local_50.parser_ = (Parser *)&stack0xffffffffffffffc0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Reached end of input in method options (missing \'}\').","");
    pEVar1 = this->error_collector_;
    if (pEVar1 != (ErrorCollector *)0x0) {
      (*pEVar1->_vptr_ErrorCollector[2])
                (pEVar1,(ulong)(uint)(this->input_->current_).line,
                 (ulong)(uint)(this->input_->current_).column,&local_50);
    }
    this->had_errors_ = true;
    if (local_50.parser_ != (Parser *)&stack0xffffffffffffffc0) {
      operator_delete(local_50.parser_,(ulong)((long)&(local_40->current_).type + 1));
    }
  }
  return bVar2;
}

Assistant:

bool Parser::ParseOptions(const LocationRecorder& parent_location,
                          const int optionsFieldNumber,
                          Message* mutable_options) {
  // Options!
  ConsumeEndOfDeclaration("{", &parent_location);
  while (!TryConsumeEndOfDeclaration("}", NULL)) {
    if (AtEnd()) {
      AddError("Reached end of input in method options (missing '}').");
      return false;
    }

    if (TryConsumeEndOfDeclaration(";", NULL)) {
      // empty statement; ignore
    } else {
      LocationRecorder location(parent_location,
                                optionsFieldNumber);
      if (!ParseOption(mutable_options, location, OPTION_STATEMENT)) {
        // This statement failed to parse.  Skip it, but keep looping to
        // parse other statements.
        SkipStatement();
      }
    }
  }

  return true;
}